

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

bool __thiscall
imrt::ApertureILS::isBeamletModifiable
          (ApertureILS *this,int beamlet,Station *station,bool open_flag)

{
  bool bVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->tabu).
           super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->tabu) {
    do {
      if ((*(int *)&(p_Var2[1]._M_next)->_M_prev == station->angle) &&
         (*(int *)&p_Var2[1]._M_prev == beamlet)) {
        return false;
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->tabu);
  }
  bVar1 = Station::isActiveBeamlet(station,beamlet);
  if (bVar1) {
    if (open_flag) {
      bVar1 = Station::anyClosed(station,beamlet);
      if ((bVar1) && ((this->super_ILS).field_0x25 != '\0')) {
        return true;
      }
      bVar1 = Station::canIncreaseIntensity(station,beamlet);
    }
    else {
      bVar1 = Station::anyOpen(station,beamlet);
      if ((bVar1) && ((this->super_ILS).field_0x25 != '\0')) {
        return true;
      }
      bVar1 = Station::canReduceIntensity(station,beamlet);
    }
    if ((bVar1 != false) && ((this->super_ILS).field_0x24 != '\0')) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ApertureILS::isBeamletModifiable(int beamlet, Station* station, bool open_flag) {
  for (auto it=tabu.begin(); it!=tabu.end();it++){
    if (it->first->getAngle() == station->getAngle() && it->second == beamlet) return(false);
  }
  
  if (!station->isActiveBeamlet(beamlet)) return(false);
  if (!open_flag) {
    if (station->anyOpen(beamlet) && search_aperture)
      return(true);
    if (station->canReduceIntensity(beamlet) && search_intensity)
      return(true);
  } else {
    if (station->anyClosed(beamlet) && search_aperture)
      return(true);
    if (station->canIncreaseIntensity(beamlet) && search_intensity)
      return(true);    
  }
  return(false);
}